

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-atom.c
# Opt level: O3

fy_atom * fy_fill_atom(fy_parser *fyp,int advance,fy_atom *handle)

{
  uint uVar1;
  int iVar2;
  size_t advance_00;
  
  fy_fill_atom_start(fyp,handle);
  if (0 < advance) {
    do {
      uVar1 = fy_parse_peek_at_offset(fyp,0);
      if ((int)uVar1 < 0) break;
      if (uVar1 < 0x80) {
        fy_advance_octets(fyp,1);
        if (uVar1 != 0xd) goto LAB_0013e209;
        iVar2 = fy_parse_peek_at_offset(fyp,0);
        if (iVar2 != 10) {
          if (fyp != (fy_parser *)0x0) goto LAB_0013e26a;
LAB_0013e278:
          fyp->column = fyp->column + 1;
          goto LAB_0013e27c;
        }
        fy_advance_octets(fyp,1);
LAB_0013e26a:
        fyp->column = 0;
        fyp->nontab_column = 0;
        fyp->line = fyp->line + 1;
      }
      else {
        advance_00 = 4 - (ulong)(uVar1 < 0x10000);
        if (uVar1 < 0x800) {
          advance_00 = 2;
        }
        fy_advance_octets(fyp,advance_00);
LAB_0013e209:
        if ((fyp != (fy_parser *)0x0) &&
           (((uVar1 == 10 || (uVar1 == 0xd)) ||
            (((fyp->current_input == (fy_input *)0x0 || ((fyp->current_input->field_0x74 & 1) == 0))
             && ((uVar1 - 0x2028 < 2 || (uVar1 == 0x85)))))))) goto LAB_0013e26a;
        iVar2 = fyp->tabsize;
        if (uVar1 != 9 || iVar2 == 0) goto LAB_0013e278;
        fyp->column = (fyp->column + iVar2) - fyp->column % iVar2;
LAB_0013e27c:
        fyp->nontab_column = fyp->nontab_column + 1;
      }
      advance = advance + -1;
    } while (advance != 0);
  }
  fy_fill_atom_end_at(fyp,handle,(fy_mark *)0x0);
  return handle;
}

Assistant:

struct fy_atom *fy_fill_atom(struct fy_parser *fyp, int advance, struct fy_atom *handle) {
    /* start mark */
    fy_fill_atom_start(fyp, handle);

    /* advance the given number of characters */
    if (advance > 0)
        fy_advance_by(fyp, advance);

    fy_fill_atom_end(fyp, handle);

    return handle;
}